

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Resize
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t newDim,int64_t param_3)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  complex<double> **ppcVar4;
  long in_RSI;
  long *in_RDI;
  int64_t in_stack_00000008;
  TPZVec<std::complex<double>_> *in_stack_00000010;
  int64_t i;
  int64_t min;
  TPZVec<std::complex<double>_*> *in_stack_ffffffffffffffd0;
  
  lVar3 = in_RSI;
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if (lVar3 != lVar2) {
    TPZVec<std::complex<double>_*>::Resize(in_stack_ffffffffffffffd0,lVar3);
    lVar2 = (**(code **)(*in_RDI + 0x60))();
    lVar3 = in_RSI;
    if (lVar2 <= in_RSI) {
      lVar3 = (**(code **)(*in_RDI + 0x60))();
    }
    while (lVar2 = lVar3 + 1, lVar2 <= in_RSI) {
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),lVar3);
      pcVar1 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),lVar2);
      *ppcVar4 = pcVar1;
      lVar3 = lVar2;
    }
    TPZVec<std::complex<double>_*>::operator[]
              ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),in_RSI);
    TPZVec<std::complex<double>_*>::operator[]((TPZVec<std::complex<double>_*> *)(in_RDI + 4),0);
    TPZVec<std::complex<double>_>::Resize(in_stack_00000010,in_stack_00000008);
    in_RDI[2] = in_RSI;
    in_RDI[1] = in_RSI;
    *(undefined1 *)(in_RDI + 3) = 0;
  }
  return 1;
}

Assistant:

int TPZSkylMatrix<TVar>::Resize( int64_t newDim ,int64_t ) {
	if ( newDim == this->Dim() )
		return( 1 );
	
	fElem.Resize(newDim+1);
	// Cria nova matrix.
	
	// Copia os elementos para a nova matriz.
	int64_t min = MIN( newDim, this->Dim() );
	int64_t i;
	for ( i = min+1; i <= newDim; i++ )
		fElem[i] = fElem[i-1];
	
	// Zera as posicoes que sobrarem (se sobrarem)
	fStorage.Resize(fElem[newDim]-fElem[0]);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}